

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validation.cpp
# Opt level: O0

bool TestBlockValidity(BlockValidationState *state,CChainParams *chainparams,Chainstate *chainstate,
                      CBlock *block,CBlockIndex *pindexPrev,bool fCheckPOW,bool fCheckMerkleRoot)

{
  long lVar1;
  string_view source_file;
  string_view source_file_00;
  string_view source_file_01;
  string_view logging_function;
  string_view logging_function_00;
  string_view logging_function_01;
  bool bVar2;
  int iVar3;
  CCoinsViewCache *pCVar4;
  Params *this;
  size_t in_RCX;
  char *in_RDX;
  LogFlags in_RSI;
  char *in_RDI;
  CCoinsViewCache *in_R8;
  long in_FS_OFFSET;
  bool in_stack_00000127;
  CCoinsViewCache *in_stack_00000128;
  BlockValidationState *in_stack_00000130;
  CBlock *in_stack_00000138;
  Chainstate *in_stack_00000140;
  CBlockIndex indexDummy;
  uint256 block_hash;
  CCoinsViewCache viewNew;
  CBlockIndex *in_stack_000005a8;
  undefined4 in_stack_fffffffffffffbd8;
  int in_stack_fffffffffffffbdc;
  CBlockHeader *in_stack_fffffffffffffbe0;
  CBlockIndex *in_stack_fffffffffffffbe8;
  char *in_stack_fffffffffffffbf0;
  Chainstate *in_stack_fffffffffffffbf8;
  ValidationState<BlockValidationResult> *in_stack_fffffffffffffc18;
  undefined7 in_stack_fffffffffffffc20;
  undefined1 in_stack_fffffffffffffc27;
  CCoinsViewCache *in_stack_fffffffffffffc28;
  uint in_stack_fffffffffffffc4c;
  ConstevalFormatString<2U> fmt;
  LogFlags LVar5;
  bool local_349;
  undefined1 in_stack_fffffffffffffce6;
  undefined1 in_stack_fffffffffffffce7;
  Params *in_stack_fffffffffffffce8;
  ChainstateManager *in_stack_fffffffffffffcf0;
  CBlock *in_stack_fffffffffffffcf8;
  CBlockIndex *in_stack_fffffffffffffd00;
  ChainstateManager *in_stack_fffffffffffffd08;
  BlockManager *in_stack_fffffffffffffd10;
  BlockValidationState *in_stack_fffffffffffffd18;
  CBlockHeader *in_stack_fffffffffffffd20;
  Level level;
  undefined4 in_stack_fffffffffffffd94;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffd98;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  LVar5 = in_RSI;
  AssertLockHeldInternal<AnnotatedMixin<std::recursive_mutex>>
            ((char *)in_stack_fffffffffffffbe8,(char *)in_stack_fffffffffffffbe0,
             in_stack_fffffffffffffbdc,(AnnotatedMixin<std::recursive_mutex> *)0x14a3429);
  in_stack_fffffffffffffc4c = in_stack_fffffffffffffc4c & 0xffffff;
  fmt.fmt = (char *)in_R8;
  if (in_R8 != (CCoinsViewCache *)0x0) {
    pCVar4 = (CCoinsViewCache *)CChain::Tip((CChain *)in_stack_fffffffffffffbe8);
    in_stack_fffffffffffffc4c = CONCAT13(in_R8 == pCVar4,(int3)in_stack_fffffffffffffc4c);
    in_stack_fffffffffffffc28 = in_R8;
  }
  if ((char)(in_stack_fffffffffffffc4c >> 0x18) == '\0') {
    __assert_fail("pindexPrev && pindexPrev == chainstate.m_chain.Tip()",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/validation.cpp"
                  ,0x1201,
                  "bool TestBlockValidity(BlockValidationState &, const CChainParams &, Chainstate &, const CBlock &, CBlockIndex *, bool, bool)"
                 );
  }
  Chainstate::CoinsTip(in_stack_fffffffffffffbf8);
  CCoinsViewCache::CCoinsViewCache
            (in_stack_fffffffffffffc28,
             (CCoinsView *)CONCAT17(in_stack_fffffffffffffc27,in_stack_fffffffffffffc20),
             SUB81((ulong)in_stack_fffffffffffffc18 >> 0x38,0));
  CBlockHeader::GetHash((CBlockHeader *)in_stack_fffffffffffffbf8);
  CBlockIndex::CBlockIndex(in_stack_fffffffffffffbe8,in_stack_fffffffffffffbe0);
  iVar3 = *(int *)((((CCoinsViewCache *)fmt.fmt)->hashBlock).super_base_blob<256U>.m_data._M_elems +
                  7) + 1;
  pCVar4 = (CCoinsViewCache *)fmt.fmt;
  bVar2 = ContextualCheckBlockHeader
                    (in_stack_fffffffffffffd20,in_stack_fffffffffffffd18,in_stack_fffffffffffffd10,
                     in_stack_fffffffffffffd08,in_stack_fffffffffffffd00);
  level = (Level)pCVar4;
  if (bVar2) {
    this = CChainParams::GetConsensus
                     ((CChainParams *)CONCAT44(in_stack_fffffffffffffbdc,in_stack_fffffffffffffbd8))
    ;
    bVar2 = CheckBlock(in_stack_fffffffffffffcf8,(BlockValidationState *)in_stack_fffffffffffffcf0,
                       in_stack_fffffffffffffce8,(bool)in_stack_fffffffffffffce7,
                       (bool)in_stack_fffffffffffffce6);
    if (bVar2) {
      bVar2 = ContextualCheckBlock
                        ((CBlock *)in_stack_fffffffffffffd00,
                         (BlockValidationState *)in_stack_fffffffffffffcf8,in_stack_fffffffffffffcf0
                         ,(CBlockIndex *)in_stack_fffffffffffffce8);
      if (bVar2) {
        bVar2 = Chainstate::ConnectBlock
                          (in_stack_00000140,in_stack_00000138,in_stack_00000130,in_stack_000005a8,
                           in_stack_00000128,in_stack_00000127);
        if (bVar2) {
          bVar2 = ValidationState<BlockValidationResult>::IsValid
                            ((ValidationState<BlockValidationResult> *)
                             CONCAT44(in_stack_fffffffffffffbdc,in_stack_fffffffffffffbd8));
          if (!bVar2) {
            __assert_fail("state.IsValid()",
                          "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/validation.cpp"
                          ,0x1219,
                          "bool TestBlockValidity(BlockValidationState &, const CChainParams &, Chainstate &, const CBlock &, CBlockIndex *, bool, bool)"
                         );
          }
          local_349 = true;
        }
        else {
          local_349 = false;
        }
      }
      else {
        std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                  ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffffbf8,
                   in_stack_fffffffffffffbf0);
        std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                  ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffffbf8,
                   in_stack_fffffffffffffbf0);
        ValidationState<BlockValidationResult>::ToString_abi_cxx11_
                  ((ValidationState<BlockValidationResult> *)this);
        in_stack_fffffffffffffbd8 = 4;
        logging_function_01._M_str = in_RDI;
        logging_function_01._M_len = LVar5;
        source_file_01._M_str = in_RDX;
        source_file_01._M_len = in_RCX;
        LogPrintFormatInternal<char[18],std::__cxx11::string>
                  (logging_function_01,source_file_01,in_stack_fffffffffffffc4c,in_RSI,level,fmt,
                   (char (*) [18])CONCAT44(in_stack_fffffffffffffd94,iVar3),
                   in_stack_fffffffffffffd98);
        std::__cxx11::string::~string
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT44(in_stack_fffffffffffffbdc,in_stack_fffffffffffffbd8));
        local_349 = false;
      }
    }
    else {
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffffbf8,
                 in_stack_fffffffffffffbf0);
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffffbf8,
                 in_stack_fffffffffffffbf0);
      ValidationState<BlockValidationResult>::ToString_abi_cxx11_
                ((ValidationState<BlockValidationResult> *)this);
      in_stack_fffffffffffffbd8 = 4;
      logging_function_00._M_str = in_RDI;
      logging_function_00._M_len = LVar5;
      source_file_00._M_str = in_RDX;
      source_file_00._M_len = in_RCX;
      LogPrintFormatInternal<char[18],std::__cxx11::string>
                (logging_function_00,source_file_00,in_stack_fffffffffffffc4c,in_RSI,level,fmt,
                 (char (*) [18])CONCAT44(in_stack_fffffffffffffd94,iVar3),in_stack_fffffffffffffd98)
      ;
      std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(in_stack_fffffffffffffbdc,in_stack_fffffffffffffbd8));
      local_349 = false;
    }
  }
  else {
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffffbf8,
               in_stack_fffffffffffffbf0);
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffffbf8,
               in_stack_fffffffffffffbf0);
    ValidationState<BlockValidationResult>::ToString_abi_cxx11_(in_stack_fffffffffffffc18);
    in_stack_fffffffffffffbd8 = 4;
    logging_function._M_str = in_RDI;
    logging_function._M_len = LVar5;
    source_file._M_str = in_RDX;
    source_file._M_len = in_RCX;
    LogPrintFormatInternal<char[18],std::__cxx11::string>
              (logging_function,source_file,in_stack_fffffffffffffc4c,in_RSI,level,fmt,
               (char (*) [18])CONCAT44(in_stack_fffffffffffffd94,iVar3),in_stack_fffffffffffffd98);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT44(in_stack_fffffffffffffbdc,in_stack_fffffffffffffbd8));
    local_349 = false;
  }
  CCoinsViewCache::~CCoinsViewCache
            ((CCoinsViewCache *)CONCAT44(in_stack_fffffffffffffbdc,in_stack_fffffffffffffbd8));
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return local_349;
  }
  __stack_chk_fail();
}

Assistant:

bool TestBlockValidity(BlockValidationState& state,
                       const CChainParams& chainparams,
                       Chainstate& chainstate,
                       const CBlock& block,
                       CBlockIndex* pindexPrev,
                       bool fCheckPOW,
                       bool fCheckMerkleRoot)
{
    AssertLockHeld(cs_main);
    assert(pindexPrev && pindexPrev == chainstate.m_chain.Tip());
    CCoinsViewCache viewNew(&chainstate.CoinsTip());
    uint256 block_hash(block.GetHash());
    CBlockIndex indexDummy(block);
    indexDummy.pprev = pindexPrev;
    indexDummy.nHeight = pindexPrev->nHeight + 1;
    indexDummy.phashBlock = &block_hash;

    // NOTE: CheckBlockHeader is called by CheckBlock
    if (!ContextualCheckBlockHeader(block, state, chainstate.m_blockman, chainstate.m_chainman, pindexPrev)) {
        LogError("%s: Consensus::ContextualCheckBlockHeader: %s\n", __func__, state.ToString());
        return false;
    }
    if (!CheckBlock(block, state, chainparams.GetConsensus(), fCheckPOW, fCheckMerkleRoot)) {
        LogError("%s: Consensus::CheckBlock: %s\n", __func__, state.ToString());
        return false;
    }
    if (!ContextualCheckBlock(block, state, chainstate.m_chainman, pindexPrev)) {
        LogError("%s: Consensus::ContextualCheckBlock: %s\n", __func__, state.ToString());
        return false;
    }
    if (!chainstate.ConnectBlock(block, state, &indexDummy, viewNew, true)) {
        return false;
    }
    assert(state.IsValid());

    return true;
}